

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void ppu_end_vblank(gba_ppu_t *ppu)

{
  undefined2 *in_RDI;
  
  *(undefined4 *)(in_RDI + 0x1f658) = *(undefined4 *)(in_RDI + 0x1f656);
  *(undefined4 *)(in_RDI + 0x1f660) = *(undefined4 *)(in_RDI + 0x1f65e);
  *(undefined4 *)(in_RDI + 0x1f65c) = *(undefined4 *)(in_RDI + 0x1f65a);
  *(undefined4 *)(in_RDI + 0x1f664) = *(undefined4 *)(in_RDI + 0x1f662);
  *in_RDI = 0;
  check_vcount((gba_ppu_t *)0x15e1e7);
  if (((dbg_window_visible & 1U) != 0) && (tick_on == FRAME)) {
    actual_dbg_tick();
  }
  in_RDI[0x1f666] = in_RDI[0x1f666] & 0xfffe;
  return;
}

Assistant:

void ppu_end_vblank(gba_ppu_t* ppu) {
    ppu->BG2X.current.raw = ppu->BG2X.initial.raw;
    ppu->BG3X.current.raw = ppu->BG3X.initial.raw;
    ppu->BG2Y.current.raw = ppu->BG2Y.initial.raw;
    ppu->BG3Y.current.raw = ppu->BG3Y.initial.raw;

    ppu->y = 0;
    check_vcount(ppu);
    dbg_tick(FRAME);
    ppu->DISPSTAT.vblank = false;
}